

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O2

void __thiscall ASDCP::MXF::DMSegment::Copy(DMSegment *this,DMSegment *rhs)

{
  undefined8 uVar1;
  
  InterchangeObject::Copy(&this->super_InterchangeObject,&rhs->super_InterchangeObject);
  (this->DataDefinition).super_Identifier<16U>.m_HasValue =
       (rhs->DataDefinition).super_Identifier<16U>.m_HasValue;
  uVar1 = *(undefined8 *)((rhs->DataDefinition).super_Identifier<16U>.m_Value + 8);
  *(undefined8 *)(this->DataDefinition).super_Identifier<16U>.m_Value =
       *(undefined8 *)(rhs->DataDefinition).super_Identifier<16U>.m_Value;
  *(undefined8 *)((this->DataDefinition).super_Identifier<16U>.m_Value + 8) = uVar1;
  (this->Duration).m_property = (rhs->Duration).m_property;
  (this->Duration).m_has_value = (rhs->Duration).m_has_value;
  (this->EventStartPosition).m_property = (rhs->EventStartPosition).m_property;
  (this->EventStartPosition).m_has_value = (rhs->EventStartPosition).m_has_value;
  optional_property<ASDCP::MXF::UTF16String>::operator=(&this->EventComment,&rhs->EventComment);
  (this->DMFramework).super_Identifier<16U>.m_HasValue =
       (rhs->DMFramework).super_Identifier<16U>.m_HasValue;
  uVar1 = *(undefined8 *)((rhs->DMFramework).super_Identifier<16U>.m_Value + 8);
  *(undefined8 *)(this->DMFramework).super_Identifier<16U>.m_Value =
       *(undefined8 *)(rhs->DMFramework).super_Identifier<16U>.m_Value;
  *(undefined8 *)((this->DMFramework).super_Identifier<16U>.m_Value + 8) = uVar1;
  return;
}

Assistant:

void
DMSegment::Copy(const DMSegment& rhs)
{
  InterchangeObject::Copy(rhs);
  DataDefinition = rhs.DataDefinition;
  Duration = rhs.Duration;
  EventStartPosition = rhs.EventStartPosition;
  EventComment = rhs.EventComment;
  DMFramework = rhs.DMFramework;
}